

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O0

void __thiscall
ADE_DEP_DPFSP::LS1EXC
          (ADE_DEP_DPFSP *this,Permutazione *p,uint iF,int *indiciFabbriche,uint *cFabbriche)

{
  unsigned_short uVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  unsigned_short *puVar7;
  ushort local_78;
  ushort local_76;
  unsigned_short j;
  unsigned_short i;
  unsigned_short tmp;
  unsigned_short indice2;
  unsigned_short indice1;
  unsigned_short miglioreCosto;
  unsigned_short nuovoCosto;
  unsigned_short miglioreIndice2;
  unsigned_short miglioreIndice1;
  bool miglioramento;
  undefined1 local_58 [8];
  IndiciRandom indRand;
  unsigned_short *indici;
  unsigned_short posizioniDaSelezionare;
  uint *puStack_30;
  unsigned_short dimensioneFabbrica;
  uint *cFabbriche_local;
  int *indiciFabbriche_local;
  Permutazione *pPStack_18;
  uint iF_local;
  Permutazione *p_local;
  ADE_DEP_DPFSP *this_local;
  
  indici._6_2_ = ((short)indiciFabbriche[iF + 1] - (short)indiciFabbriche[iF]) + 1;
  puStack_30 = cFabbriche;
  cFabbriche_local = (uint *)indiciFabbriche;
  indiciFabbriche_local._4_4_ = iF;
  pPStack_18 = p;
  p_local = (Permutazione *)this;
  iVar5 = Random::randIntU(&genRand,2,0x32);
  indici._2_2_ = (undefined2)iVar5;
  puVar7 = std::min<unsigned_short>
                     ((unsigned_short *)((long)&indici + 6),(unsigned_short *)((long)&indici + 2));
  indici._4_2_ = *puVar7;
  indRand.random = (Random *)operator_new__((ulong)indici._4_2_ * 2);
  IndiciRandom::IndiciRandom((IndiciRandom *)local_58,&genRand,indici._6_2_);
  IndiciRandom::generaIndici((IndiciRandom *)local_58,(unsigned_short *)indRand.random,indici._4_2_)
  ;
  bVar2 = false;
  i = (unsigned_short)puStack_30[indiciFabbriche_local._4_4_ >> 1];
  for (local_76 = 0; (int)(uint)local_76 < (int)(indici._4_2_ - 1); local_76 = local_76 + 1) {
    uVar3 = (short)cFabbriche_local[indiciFabbriche_local._4_4_] +
            *(short *)((long)((indRand.random)->gen)._M_x + (ulong)local_76 * 2);
    local_78 = local_76;
    while (local_78 = local_78 + 1, local_78 < indici._4_2_) {
      uVar4 = (short)cFabbriche_local[indiciFabbriche_local._4_4_] +
              *(short *)((long)((indRand.random)->gen)._M_x + (ulong)local_78 * 2);
      uVar1 = pPStack_18->individuo[uVar3];
      pPStack_18->individuo[uVar3] = pPStack_18->individuo[uVar4];
      pPStack_18->individuo[uVar4] = uVar1;
      uVar6 = valutaIndividuoParziale
                        (this,pPStack_18->individuo +
                              (int)cFabbriche_local[indiciFabbriche_local._4_4_],indici._6_2_);
      if ((uVar6 & 0xffff) < (uint)i) {
        bVar2 = true;
        i = (unsigned_short)uVar6;
        indice2 = uVar4;
        indice1 = uVar3;
      }
      uVar1 = pPStack_18->individuo[uVar3];
      pPStack_18->individuo[uVar3] = pPStack_18->individuo[uVar4];
      pPStack_18->individuo[uVar4] = uVar1;
    }
  }
  if (bVar2) {
    uVar1 = pPStack_18->individuo[indice1];
    pPStack_18->individuo[indice1] = pPStack_18->individuo[indice2];
    pPStack_18->individuo[indice2] = uVar1;
    puStack_30[indiciFabbriche_local._4_4_ >> 1] = (uint)i;
  }
  if (indRand.random != (Random *)0x0) {
    operator_delete__(indRand.random);
  }
  IndiciRandom::~IndiciRandom((IndiciRandom *)local_58);
  return;
}

Assistant:

void ADE_DEP_DPFSP::LS1EXC(Permutazione* p, unsigned int iF, int* indiciFabbriche, unsigned int* cFabbriche) {
	
	unsigned short dimensioneFabbrica = indiciFabbriche[iF + 1] - indiciFabbriche[iF] + 1;

	unsigned short  posizioniDaSelezionare = min(dimensioneFabbrica, (unsigned short)genRand.randIntU(2, 50));

	unsigned short* indici = new unsigned short[posizioniDaSelezionare];
	
	IndiciRandom indRand(&genRand, dimensioneFabbrica);

	indRand.generaIndici(indici, posizioniDaSelezionare);

	bool miglioramento = false;
	unsigned short miglioreIndice1, miglioreIndice2, nuovoCosto, miglioreCosto = cFabbriche[iF / 2],
		indice1, indice2, tmp;

	for (unsigned short i = 0; i < posizioniDaSelezionare - 1; i++) {
		indice1 = indiciFabbriche[iF] + indici[i];

		for (unsigned short j = i + 1; j < posizioniDaSelezionare; j++) {
			indice2 = indiciFabbriche[iF] + indici[j];

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;

			nuovoCosto = valutaIndividuoParziale(&p->individuo[indiciFabbriche[iF]], dimensioneFabbrica);
			if (nuovoCosto < miglioreCosto) {
				miglioreCosto = nuovoCosto;
				miglioreIndice1 = indice1;
				miglioreIndice2 = indice2;
				miglioramento = true;
			}

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;
		}
	}

	if (miglioramento) {
		tmp = p->individuo[miglioreIndice1];
		p->individuo[miglioreIndice1] = p->individuo[miglioreIndice2];
		p->individuo[miglioreIndice2] = tmp;

		cFabbriche[iF / 2] = miglioreCosto;
	}

	delete[] indici;
}